

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:521:39)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:521:39)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  float fVar3;
  Vec3f p;
  pointer local_58;
  undefined4 local_50;
  _Any_data local_48;
  code *local_38;
  pointer ppStack_30;
  pointer local_28;
  pointer ppStack_20;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)&local_58);
  fVar3 = ParseStream::getFloat(this_00);
  iVar2 = ParseStream::getInt(this_00);
  local_28 = local_58;
  ppStack_20 = (pointer)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  ppStack_30 = (pointer)0x0;
  local_48._M_unused._M_object = operator_new(0x20);
  *(SceneLoadingTutorialApplication **)local_48._M_unused._0_8_ = pSVar1;
  *(pointer *)((long)local_48._M_unused._0_8_ + 8) = local_28;
  *(undefined4 *)((long)local_48._M_unused._0_8_ + 0x10) = local_50;
  *(float *)((long)local_48._M_unused._0_8_ + 0x14) = fVar3;
  *(long *)((long)local_48._M_unused._0_8_ + 0x18) = (long)iVar2;
  ppStack_30 = (pointer)std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:525:27)>
                        ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:525:27)>
             ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }